

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O0

parser_error parse_prefs_object(parser *p)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  byte *pbVar5;
  char *__s1;
  char *__s1_00;
  object_kind *poVar6;
  object_kind *kind_local_1;
  flavor *flavor_1;
  size_t i_1;
  wchar_t chr_1;
  uint8_t attr_1;
  object_kind *kind_local;
  flavor *flavor;
  size_t i;
  wchar_t chr;
  uint8_t attr;
  prefs_data *d;
  char *sval;
  char *tval;
  object_kind *kind;
  wchar_t svi;
  wchar_t tvi;
  parser *p_local;
  
  pbVar5 = (byte *)parser_priv(p);
  if (pbVar5 == (byte *)0x0) {
    __assert_fail("d != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-prefs.c"
                  ,0x260,"enum parser_error parse_prefs_object(struct parser *)");
  }
  if ((*pbVar5 & 1) != 0) {
    return PARSE_ERROR_NONE;
  }
  __s1 = parser_getsym(p,"tval");
  __s1_00 = parser_getsym(p,"sval");
  iVar1 = strcmp(__s1,"*");
  if (iVar1 == 0) {
    wVar2 = parser_getint(p,"attr");
    wVar3 = parser_getint(p,"char");
    iVar1 = strcmp(__s1_00,"*");
    if (iVar1 != 0) {
      return PARSE_ERROR_UNRECOGNISED_SVAL;
    }
    for (flavor = (flavor *)0x0; poVar6 = k_info, flavor < (flavor *)(ulong)z_info->k_max;
        flavor = (flavor *)((long)&flavor->text + 1)) {
      kind_x_attr[k_info[(long)flavor].kidx] = (uint8_t)wVar2;
      kind_x_char[poVar6[(long)flavor].kidx] = wVar3;
    }
    for (kind_local = (object_kind *)flavors; kind_local != (object_kind *)0x0;
        kind_local = (object_kind *)kind_local->text) {
      flavor_x_attr[*(uint *)&kind_local->base] = (uint8_t)wVar2;
      flavor_x_char[*(uint *)&kind_local->base] = wVar3;
    }
  }
  else {
    wVar2 = tval_find_idx(__s1);
    if (wVar2 < L'\0') {
      return PARSE_ERROR_UNRECOGNISED_TVAL;
    }
    iVar1 = strcmp(__s1_00,"*");
    if (iVar1 == 0) {
      wVar3 = parser_getint(p,"attr");
      wVar4 = parser_getint(p,"char");
      for (flavor_1 = (flavor *)0x0; poVar6 = k_info, flavor_1 < (flavor *)(ulong)z_info->k_max;
          flavor_1 = (flavor *)((long)&flavor_1->text + 1)) {
        if (k_info[(long)flavor_1].tval == wVar2) {
          kind_x_attr[k_info[(long)flavor_1].kidx] = (uint8_t)wVar3;
          kind_x_char[poVar6[(long)flavor_1].kidx] = wVar4;
        }
      }
      for (kind_local_1 = (object_kind *)flavors; kind_local_1 != (object_kind *)0x0;
          kind_local_1 = (object_kind *)kind_local_1->text) {
        if ((uint)*(byte *)((long)&kind_local_1->base + 4) == wVar2) {
          flavor_x_attr[*(uint *)&kind_local_1->base] = (uint8_t)wVar3;
          flavor_x_char[*(uint *)&kind_local_1->base] = wVar4;
        }
      }
    }
    else {
      wVar3 = lookup_sval(wVar2,__s1_00);
      if (wVar3 < L'\0') {
        return PARSE_ERROR_NONE;
      }
      poVar6 = lookup_kind(wVar2,wVar3);
      if (poVar6 == (object_kind *)0x0) {
        return PARSE_ERROR_NONE;
      }
      wVar2 = parser_getint(p,"attr");
      kind_x_attr[poVar6->kidx] = (uint8_t)wVar2;
      wVar2 = parser_getint(p,"char");
      kind_x_char[poVar6->kidx] = wVar2;
    }
  }
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_prefs_object(struct parser *p)
{
	int tvi, svi;
	struct object_kind *kind;
	const char *tval, *sval;

	struct prefs_data *d = parser_priv(p);
	assert(d != NULL);
	if (d->bypass) return PARSE_ERROR_NONE;

	tval = parser_getsym(p, "tval");
	sval = parser_getsym(p, "sval");
	if (streq(tval, "*")) {
		/* object:*:* means handle all objects and flavors */
		uint8_t attr = parser_getint(p, "attr");
		wchar_t chr = parser_getint(p, "char");
		size_t i;
		struct flavor *flavor;

		if (!streq(sval, "*"))
			return PARSE_ERROR_UNRECOGNISED_SVAL;

		for (i = 0; i < z_info->k_max; i++) {
			struct object_kind *kind_local = &k_info[i];

			kind_x_attr[kind_local->kidx] = attr;
			kind_x_char[kind_local->kidx] = chr;
		}

		for (flavor = flavors; flavor; flavor = flavor->next) {
			flavor_x_attr[flavor->fidx] = attr;
			flavor_x_char[flavor->fidx] = chr;
		}
	} else {
		tvi = tval_find_idx(tval);
		if (tvi < 0)
			return PARSE_ERROR_UNRECOGNISED_TVAL;

		/* object:tval:* means handle all objects and flavors with this tval */
		if (streq(sval, "*")) {
			uint8_t attr = parser_getint(p, "attr");
			wchar_t chr = parser_getint(p, "char");
			size_t i;
			struct flavor *flavor;

			for (i = 0; i < z_info->k_max; i++) {
				struct object_kind *kind_local = &k_info[i];

				if (kind_local->tval != tvi)
					continue;

				kind_x_attr[kind_local->kidx] = attr;
				kind_x_char[kind_local->kidx] = chr;
			}

			for (flavor = flavors; flavor; flavor = flavor->next)
				if (flavor->tval == tvi) {
					flavor_x_attr[flavor->fidx] = attr;
					flavor_x_char[flavor->fidx] = chr;
				}

		} else {
			/* No error at incorrect sval to stop failure due to outdated
			 * pref files and enable switching between old and new classes */
			svi = lookup_sval(tvi, sval);
			if (svi < 0)
				return PARSE_ERROR_NONE;

			kind = lookup_kind(tvi, svi);
			if (!kind)
				return PARSE_ERROR_NONE;

			kind_x_attr[kind->kidx] = (uint8_t)parser_getint(p, "attr");
			kind_x_char[kind->kidx] = (wchar_t)parser_getint(p, "char");
		}
	}

	return PARSE_ERROR_NONE;
}